

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

void __thiscall
SGParser::Parse<SGParser::Generator::StdGrammarStackElement>::CleanupParseStack
          (Parse<SGParser::Generator::StdGrammarStackElement> *this,size_t tillPos)

{
  size_t markerIndex;
  StdGrammarStackElement *pSVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = this->StackPosition;
  if (tillPos < uVar2) {
    lVar3 = uVar2 * 0x38;
    do {
      pSVar1 = this->pStack;
      markerIndex = *(size_t *)
                     ((long)&(pSVar1->super_ParseStackElement<SGParser::Generator::StdGrammarToken>)
                             .TerminalMarker + lVar3);
      if (markerIndex != 0xffffffffffffffff) {
        BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::ReleaseMarker
                  (&this->Stream,markerIndex);
        pSVar1 = this->pStack;
      }
      Generator::StdGrammarStackElement::Cleanup
                ((StdGrammarStackElement *)
                 ((long)&(pSVar1->super_ParseStackElement<SGParser::Generator::StdGrammarToken>).
                         State + lVar3));
      uVar2 = uVar2 - 1;
      lVar3 = lVar3 + -0x38;
    } while (tillPos < uVar2);
  }
  this->StackPosition = tillPos;
  return;
}

Assistant:

void Parse<StackElement>::CleanupParseStack(size_t tillPos) {
    // Call the destroy function for all stack elements (except 0 - special element)
    for (auto i = StackPosition; i > tillPos; --i) {
        if (pStack[i].TerminalMarker != InvalidIndex)
            Stream.ReleaseMarker(pStack[i].TerminalMarker);
        pStack[i].Cleanup();
    }
    // And reset position to last 'valid' element - usually 0
    StackPosition = tillPos;
}